

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

void __thiscall kj::_::BTreeImpl::reserve(BTreeImpl *this,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Fault f;
  Fault local_10;
  
  if (size >> 0x1f != 0) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
               ,0xf6,FAILED,"size < (1u << 31)","\"b-tree has reached maximum size\"",
               (char (*) [32])"b-tree has reached maximum size");
    Debug::Fault::fatal(&local_10);
  }
  uVar2 = (uint)(size / 7);
  uVar1 = uVar2 | 1;
  uVar3 = 0x1f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = ((uVar3 ^ 0x1e) >> 1 ^ 0xf) + (int)((size / 7 & 0xffffffff) / 3) + uVar2 + 4;
  if (this->treeCapacity < uVar3) {
    growTree(this,uVar3);
    return;
  }
  return;
}

Assistant:

void BTreeImpl::reserve(size_t size) {
  KJ_REQUIRE(size < (1u << 31), "b-tree has reached maximum size");

  // Calculate the worst-case number of leaves to cover the size, given that a leaf is always at
  // least half-full. (Note that it's correct for this calculation to round down, not up: The
  // remainder will necessarily be distributed among the non-full leaves, rather than creating a
  // new leaf, because if it went into a new leaf, that leaf would be less than half-full.)
  uint leaves = size / (Leaf::NROWS / 2);

  // Calculate the worst-case number of parents to cover the leaves, given that a parent is always
  // at least half-full. Since the parents form a tree with branching factor B, the size of the
  // tree is N/B + N/B^2 + N/B^3 + N/B^4 + ... = N / (B - 1). Math.
  constexpr uint branchingFactor = Parent::NCHILDREN / 2;
  uint parents = leaves / (branchingFactor - 1);

  // Height is log-base-branching-factor of leaves, plus 1 for the root node.
  uint height = lg(leaves | 1) / lg(branchingFactor) + 1;

  size_t newSize = leaves +
      parents + 1 +  // + 1 for the root
      height + 2;    // minimum freelist size needed by insert()

  if (treeCapacity < newSize) {
    growTree(newSize);
  }
}